

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O2

void __thiscall avro::MapSchema::MapSchema(MapSchema *this,Schema *valuesSchema)

{
  Node *node;
  
  node = (Node *)operator_new(0x30);
  NodeMap::NodeMap((NodeMap *)node);
  Schema::Schema(&this->super_Schema,node);
  (this->super_Schema)._vptr_Schema = (_func_int **)&PTR__Schema_001a4550;
  Node::addLeaf((this->super_Schema).node_.px,&valuesSchema->node_);
  return;
}

Assistant:

MapSchema::MapSchema(const Schema &valuesSchema) :
    Schema(new NodeMap)
{
    node_->addLeaf(valuesSchema.root());
}